

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O3

int __thiscall
cs_impl::any::holder<cs_impl::fiber::Channel<cs_impl::any>_>::kill
          (holder<cs_impl::fiber::Channel<cs_impl::any>_> *this,__pid_t __pid,int __sig)

{
  undefined8 *puVar1;
  int extraout_EAX;
  undefined4 in_register_00000014;
  undefined4 in_register_00000034;
  
  (**(this->super_baseHolder)._vptr_baseHolder)
            (this,CONCAT44(in_register_00000034,__pid),CONCAT44(in_register_00000014,__sig));
  if ((DAT_00337d88 < 0x40) && (cs::global_thread_counter == 0)) {
    puVar1 = &holder<cs_impl::fiber::Channel<cs_impl::any>>::allocator + DAT_00337d88;
    DAT_00337d88 = DAT_00337d88 + 1;
    *puVar1 = this;
    return 0x337b80;
  }
  operator_delete(this,0x28);
  return extraout_EAX;
}

Assistant:

void kill() override
			{
				allocator.free(this);
			}